

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O2

void anon_unknown.dwarf_1e8795::readValidateFile
               (char *pFilename,int pHeight,int pWidth,EImageType pImageType,bool pIsStereo)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Header *pHVar6;
  Box2i *pBVar7;
  undefined1 in_R10B;
  int pNbChannels;
  undefined8 *puVar8;
  ulong uVar9;
  undefined **ppuVar10;
  ulong uVar11;
  int pWidth_local;
  int pHeight_local;
  size_t local_100;
  Array2D<half> lPixelsLeft;
  InputFile lFile;
  Array2D<half> lPixels;
  FrameBuffer lInputFrameBuffer;
  Slice local_68;
  
  if (pImageType == IMAGE_TYPE_RGB) {
    pNbChannels = 3;
  }
  else {
    if (pImageType == IMAGE_TYPE_OTHER) {
      pNbChannels = 2;
      bVar3 = true;
      goto LAB_0016d092;
    }
    pNbChannels = 4;
  }
  bVar3 = false;
LAB_0016d092:
  lPixels._data = (half *)0x0;
  lPixels._sizeX = 0;
  lPixels._sizeY = 0;
  pWidth_local = pWidth;
  pHeight_local = pHeight;
  Imf_2_5::Array2D<half>::resizeErase(&lPixels,(long)pHeight,(long)(pWidth * pNbChannels));
  if (pIsStereo) {
    lPixelsLeft._sizeX = 0;
    lPixelsLeft._sizeY = 0;
    lPixelsLeft._data = (half *)0x0;
    Imf_2_5::Array2D<half>::resizeErase(&lPixelsLeft,(long)pHeight,(long)(pWidth * pNbChannels));
    iVar5 = Imf_2_5::globalThreadCount();
    Imf_2_5::InputFile::InputFile(&lFile,pFilename,iVar5);
    pHVar6 = Imf_2_5::InputFile::header(&lFile);
    pBVar7 = Imf_2_5::Header::dataWindow(pHVar6);
    iVar5 = (pBVar7->min).y;
    iVar1 = (pBVar7->max).y;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar11 = (ulong)(uint)(pNbChannels * 2);
    local_100 = (long)(((pBVar7->max).x - (pBVar7->min).x) + 1) * uVar11;
    ppuVar10 = &(anonymous_namespace)::CHANNEL_NAMES_LEFT;
    puVar8 = &(anonymous_namespace)::CHANNEL_NAMES;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 2) {
      pcVar2 = (char *)*puVar8;
      Imf_2_5::Slice::Slice
                (&local_68,HALF,(char *)((long)&(lPixels._data)->_h + uVar9),uVar11,local_100,1,1,
                 (double)*(float *)((long)&half::_toFloat +
                                   (ulong)(anonymous_namespace)::ALPHA_DEFAULT_VALUE * 4),
                 (bool)in_R10B,SUB21((anonymous_namespace)::ALPHA_DEFAULT_VALUE,0));
      Imf_2_5::FrameBuffer::insert(&lInputFrameBuffer,pcVar2,&local_68);
      pcVar2 = *ppuVar10;
      Imf_2_5::Slice::Slice
                (&local_68,HALF,(char *)((long)&(lPixelsLeft._data)->_h + uVar9),uVar11,local_100,1,
                 1,(double)*(float *)((long)&half::_toFloat +
                                     (ulong)(anonymous_namespace)::ALPHA_DEFAULT_VALUE * 4),
                 (bool)in_R10B,SUB21((anonymous_namespace)::ALPHA_DEFAULT_VALUE,0));
      Imf_2_5::FrameBuffer::insert(&lInputFrameBuffer,pcVar2,&local_68);
      ppuVar10 = ppuVar10 + 1;
      puVar8 = puVar8 + 1;
    }
    Imf_2_5::InputFile::setFrameBuffer(&lFile,&lInputFrameBuffer);
    Imf_2_5::InputFile::readPixels(&lFile,iVar5,iVar1);
    std::
    _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                 *)&lInputFrameBuffer);
    Imf_2_5::InputFile::~InputFile(&lFile);
    validatePixels(&pHeight_local,&pWidth_local,&lPixels,pNbChannels,false);
    validatePixels(&pHeight_local,&pWidth_local,&lPixelsLeft,pNbChannels,true);
    Imf_2_5::Array2D<half>::~Array2D(&lPixelsLeft);
  }
  else {
    iVar5 = Imf_2_5::globalThreadCount();
    Imf_2_5::InputFile::InputFile((InputFile *)&lPixelsLeft,pFilename,iVar5);
    pHVar6 = Imf_2_5::InputFile::header((InputFile *)&lPixelsLeft);
    pBVar7 = Imf_2_5::Header::dataWindow(pHVar6);
    iVar5 = (pBVar7->min).y;
    iVar1 = (pBVar7->max).y;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar11 = (ulong)(uint)(pNbChannels * 2);
    local_100 = (long)(((pBVar7->max).x - (pBVar7->min).x) + 1) * uVar11;
    puVar8 = &(anonymous_namespace)::CHANNEL_NAMES;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 2) {
      pcVar2 = (char *)*puVar8;
      Imf_2_5::Slice::Slice
                (&local_68,HALF,(char *)((long)&(lPixels._data)->_h + uVar9),uVar11,local_100,1,1,
                 (double)*(float *)((long)&half::_toFloat +
                                   (ulong)(anonymous_namespace)::ALPHA_DEFAULT_VALUE * 4),
                 (bool)in_R10B,SUB21((anonymous_namespace)::ALPHA_DEFAULT_VALUE,0));
      Imf_2_5::FrameBuffer::insert(&lInputFrameBuffer,pcVar2,&local_68);
      puVar8 = puVar8 + 1;
    }
    Imf_2_5::InputFile::setFrameBuffer((InputFile *)&lPixelsLeft,&lInputFrameBuffer);
    bVar4 = Imf_2_5::InputFile::isOptimizationEnabled((InputFile *)&lPixelsLeft);
    if (bVar4) {
      std::operator<<((ostream *)&std::cout," optimization enabled\n");
      if (bVar3) {
        std::operator<<((ostream *)&std::cerr,
                        " error: isOptimizationEnabled returned TRUE, but optimization not known to work for two channel images\n"
                       );
        __assert_fail("pNbChannels!=2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testOptimized.cpp"
                      ,0x161,
                      "void (anonymous namespace)::readPixels(const char *, int, Array2D<half> &)");
      }
    }
    else {
      std::operator<<((ostream *)&std::cout," optimization disabled\n");
    }
    Imf_2_5::InputFile::readPixels((InputFile *)&lPixelsLeft,iVar5,iVar1);
    std::
    _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                 *)&lInputFrameBuffer);
    Imf_2_5::InputFile::~InputFile((InputFile *)&lPixelsLeft);
    validatePixels(&pHeight_local,&pWidth_local,&lPixels,pNbChannels,false);
  }
  Imf_2_5::Array2D<half>::~Array2D(&lPixels);
  return;
}

Assistant:

void
readValidateFile (const char pFilename[],
                  int pHeight,
                  int pWidth,
                  EImageType
                  pImageType,
                  bool pIsStereo)
{
    const int lNbChannels = getNbChannels(pImageType);

    Array2D<half> lPixels;
    lPixels.resizeErase(pHeight, pWidth * lNbChannels);
    //readPixels(pFilename, lNbChannels, lPixels);
    //writePixels("pkTest.exr", pHeight, pWidth, lPixels, lNbChannels, NO_COMPRESSION);


    if(pIsStereo)
    {
        Array2D<half> lPixelsLeft;
        lPixelsLeft.resizeErase (pHeight, pWidth * lNbChannels);
        readPixels (pFilename, lNbChannels, lPixels, lPixelsLeft);
        validatePixels (pHeight, pWidth, lPixels, lNbChannels, false);
        validatePixels (pHeight, pWidth, lPixelsLeft, lNbChannels, true);
    }
    else
    {
        readPixels (pFilename, lNbChannels, lPixels);
        validatePixels (pHeight, pWidth, lPixels, lNbChannels, false);
    }
}